

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

void __thiscall
HighsSplitDeque::HighsSplitDeque
          (HighsSplitDeque *this,shared_ptr<WorkerBunk> *workerBunk,
          unique_ptr<HighsSplitDeque> *workers,int ownerId,int numWorkers)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  (this->ownerData).workerBunk.
  super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ownerData).workerBunk.
  super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ownerData).workers = (unique_ptr<HighsSplitDeque> *)0x0;
  (this->ownerData).randgen.state = 0x9eefcacfa6167af6;
  (this->ownerData).head = 0;
  (this->ownerData).splitCopy = 0;
  (this->ownerData).numWorkers = 0;
  (this->ownerData).ownerId = -1;
  (this->ownerData).rootTask = (HighsTask *)0x0;
  (this->ownerData).allStolenCopy = true;
  pvVar1 = operator_new(0x100);
  uVar3 = (ulong)pvVar1 | 0x3f;
  *(void **)(uVar3 - 7) = pvVar1;
  *(undefined4 *)(uVar3 + 1) = 0;
  *(undefined8 *)(uVar3 + 0x41) = 0;
  *(undefined8 *)(uVar3 + 0x49) = 0;
  *(undefined8 *)(uVar3 + 0x51) = 0;
  *(undefined8 *)(uVar3 + 0x59) = 0;
  *(undefined8 *)(uVar3 + 0x61) = 0;
  std::condition_variable::condition_variable((condition_variable *)(uVar3 + 0x69));
  (this->stealerData).semaphore.data_._M_t.
  super___uniq_ptr_impl<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_HighsBinarySemaphore::Data_*,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
  .super__Head_base<0UL,_HighsBinarySemaphore::Data_*,_false> =
       (_Head_base<0UL,_HighsBinarySemaphore::Data_*,_false>)(uVar3 + 1);
  (this->stealerData).injectedTask = (HighsTask *)0x0;
  (this->stealerData).ts.super___atomic_base<unsigned_long>._M_i = 0;
  (this->stealerData).allStolen._M_base._M_i = true;
  (this->workerBunkData).nextSleeper._M_b._M_p = (__pointer_type)0x0;
  (this->ownerData).ownerId = ownerId;
  (this->ownerData).workers = workers;
  (this->ownerData).numWorkers = numWorkers;
  (this->workerBunkData).ownerId = ownerId;
  uVar3 = (ulong)(uint)ownerId;
  lVar2 = uVar3 + 0x8a183895eeac1536;
  do {
    uVar4 = ((uVar3 & 0xffffffff) + 0xc8497d2a400d9551) * ((uVar3 >> 0x20) + 0x80c8963be3e4c2f3);
    uVar5 = ((uVar4 >> 0x20) + 0x42d8680e260ae5b) * lVar2 >> 0x20;
    uVar3 = uVar5 ^ uVar4;
  } while (uVar4 - uVar5 == 0);
  (this->ownerData).randgen.state = uVar3;
  (this->ownerData).workerBunk.
  super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (workerBunk->super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ownerData).workerBunk.
              super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(workerBunk->
              super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (this->splitRequest)._M_base._M_i = false;
  return;
}

Assistant:

HighsSplitDeque(const cache_aligned::shared_ptr<WorkerBunk>& workerBunk,
                  cache_aligned::unique_ptr<HighsSplitDeque>* workers,
                  int ownerId, int numWorkers) {
    ownerData.ownerId = ownerId;
    ownerData.workers = workers;
    ownerData.numWorkers = numWorkers;
    workerBunkData.ownerId = ownerId;
    ownerData.randgen.initialise(ownerId);
    ownerData.workerBunk = workerBunk;
    splitRequest.store(false, std::memory_order_relaxed);

    assert((reinterpret_cast<uintptr_t>(this) & 63u) == 0);
    static_assert(offsetof(HighsSplitDeque, splitRequest) == 64,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, stealerData) == 128,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, workerBunkData) == 192,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, taskArray) == 256,
                  "alignas failed to guarantee 64 byte alignment");
  }